

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O0

bool __thiscall amrex::Box::contains(Box *this,Box *b)

{
  bool bVar1;
  bool local_aa;
  bool local_a9;
  Box *b_local;
  Box *this_local;
  
  bVar1 = false;
  if (((this->smallend).vect[0] <= (b->smallend).vect[0]) &&
     (bVar1 = false, (this->smallend).vect[1] <= (b->smallend).vect[1])) {
    bVar1 = (this->smallend).vect[2] <= (b->smallend).vect[2];
  }
  local_a9 = false;
  if (bVar1) {
    local_aa = false;
    if (((b->bigend).vect[0] <= (this->bigend).vect[0]) &&
       (local_aa = false, (b->bigend).vect[1] <= (this->bigend).vect[1])) {
      local_aa = (b->bigend).vect[2] <= (this->bigend).vect[2];
    }
    local_a9 = local_aa;
  }
  return local_a9;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool contains (const Box& b) const noexcept
    {
        BL_ASSERT(sameType(b));
        return b.smallend.allGE(smallend) && b.bigend.allLE(bigend);
    }